

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_array.cpp
# Opt level: O3

void __thiscall
SparseArray_Indices_Test<pstore::uint128>::~SparseArray_Indices_Test
          (SparseArray_Indices_Test<pstore::uint128> *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TYPED_TEST (SparseArray, Indices) {
    std::set<std::size_t> indices{2, 3, 5, 7};
    auto arr =
        sparse_array<int, TypeParam>::make_unique (std::begin (indices), std::end (indices), {});

    typename sparse_array<int, TypeParam>::indices idc{*arr};
    std::vector<std::size_t> actual;
    std::copy (std::begin (idc), std::end (idc), std::back_inserter (actual));
    std::vector<std::size_t> const expected{2, 3, 5, 7};
    EXPECT_THAT (actual, ::testing::ContainerEq (expected));
}